

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall crnlib::crn_comp::quantize_images(crn_comp *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint x;
  level_details *plVar5;
  void *pvVar6;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  color_quad<unsigned_char,_int> *other;
  long in_RDI;
  vector<crnlib::crn_comp::level_details> *this_01;
  float fVar7;
  float fVar8;
  float fVar9;
  float a;
  bool result;
  uint dx;
  uint y;
  uint dy;
  uint x0;
  uint t;
  uint bx;
  uint y0;
  uint by;
  uint blockHeight;
  uint blockWidth;
  uint height;
  uint width;
  image_u8 *image;
  uint face;
  uint level;
  uint b;
  color_quad_u8 (*blocks) [16];
  uint i;
  float alpha_selector_quality;
  float alpha_endpoint_quality;
  float color_selector_quality;
  float color_endpoint_quality;
  float alpha_quality_power_mul;
  float color_quality_power_mul;
  float quality;
  uint max_codebook_entries;
  params params;
  vector<unsigned_int> *in_stack_00000260;
  vector<unsigned_int> *in_stack_00000268;
  vector<crnlib::dxt_hc::selector_indices_details> *in_stack_00000270;
  vector<crnlib::dxt_hc::endpoint_indices_details> *in_stack_00000278;
  color_quad_u8 (*in_stack_00000280) [16];
  dxt_hc *in_stack_00000288;
  vector<unsigned_int> *in_stack_000002a0;
  vector<unsigned_long_long> *in_stack_000002a8;
  params *in_stack_000002b0;
  float local_1fc;
  float local_1f4;
  uint local_1e0;
  uint local_1d8;
  uint local_1d0;
  uint local_1cc;
  uint local_1c4;
  uint local_1a4;
  uint local_1a0;
  uint local_19c;
  uint local_18c;
  float local_178;
  float local_174;
  params local_168;
  
  dxt_hc::params::params(&local_168);
  local_168.m_adaptive_tile_alpha_psnr_derating = *(float *)(*(long *)(in_RDI + 0x2c8) + 0x344);
  local_168.m_adaptive_tile_color_psnr_derating = *(float *)(*(long *)(in_RDI + 0x2c8) + 0x340);
  if ((*(uint *)(*(long *)(in_RDI + 0x2c8) + 0x20) & 0x40) == 0) {
    uVar2 = math::clamp<unsigned_int>
                      ((*(int *)(*(long *)(in_RDI + 0x2c8) + 0xc) + 3U >> 2) *
                       (*(int *)(*(long *)(in_RDI + 0x2c8) + 0x10) + 3U >> 2),8,0x2000);
    fVar7 = math::clamp<float>((float)*(uint *)(*(long *)(in_RDI + 0x2c8) + 0x32c) / 255.0,0.0,1.0);
    local_174 = 1.0;
    local_178 = 1.0;
    if ((*(byte *)(in_RDI + 0x14d3) & 1) != 0) {
      local_1f4 = 1.31;
      if ((*(byte *)(in_RDI + 0x14d4) & 1) == 0) {
        local_1f4 = 0.7;
      }
      local_174 = local_1f4;
      local_1fc = 5.0;
      if ((*(byte *)(in_RDI + 0x14d4) & 1) == 0) {
        local_1fc = 2.0;
      }
      local_168.m_adaptive_tile_color_psnr_derating = local_1fc;
    }
    if (*(long *)(*(long *)(in_RDI + 0x2c8) + 0x18) == 3) {
      local_174 = 3.5;
      local_178 = 0.35;
      local_168.m_adaptive_tile_color_psnr_derating = 5.0;
    }
    else if (*(long *)(*(long *)(in_RDI + 0x2c8) + 0x18) == 2) {
      local_174 = 0.75;
    }
    else if (*(long *)(*(long *)(in_RDI + 0x2c8) + 0x18) == 0xc) {
      local_178 = 0.9;
    }
    fVar8 = powf(fVar7,local_174 * 1.8);
    fVar9 = powf(fVar7,local_174 * 1.65);
    a = math::maximum<float>(64.0,8.0);
    fVar8 = math::lerp<float,float>(a,(float)uVar2,fVar8);
    uVar3 = math::float_to_uint(fVar8 + 0.5);
    local_168.m_color_endpoint_codebook_size = math::clamp<unsigned_int>(uVar3,8,0x2000);
    fVar8 = math::maximum<float>(96.0,8.0);
    fVar8 = math::lerp<float,float>(fVar8,(float)uVar2,fVar9);
    uVar3 = math::float_to_uint(fVar8 + 0.5);
    local_168.m_color_selector_codebook_size = math::clamp<unsigned_int>(uVar3,8,0x2000);
    fVar8 = powf(fVar7,local_178 * 2.1);
    fVar7 = powf(fVar7,local_178 * 1.65);
    fVar9 = math::maximum<float>(24.0,8.0);
    fVar8 = math::lerp<float,float>(fVar9,(float)uVar2,fVar8);
    uVar3 = math::float_to_uint(fVar8 + 0.5);
    local_168.m_alpha_endpoint_codebook_size = math::clamp<unsigned_int>(uVar3,8,0x2000);
    fVar8 = math::maximum<float>(48.0,8.0);
    fVar7 = math::lerp<float,float>(fVar8,(float)uVar2,fVar7);
    uVar3 = math::float_to_uint(fVar7 + 0.5);
    local_168.m_alpha_selector_codebook_size = math::clamp<unsigned_int>(uVar3,8,0x2000);
  }
  else {
    local_168.m_color_endpoint_codebook_size =
         math::clamp<int>(*(int *)(*(long *)(in_RDI + 0x2c8) + 0x348),8,0x2000);
    local_168.m_color_selector_codebook_size =
         math::clamp<int>(*(int *)(*(long *)(in_RDI + 0x2c8) + 0x34c),8,0x2000);
    local_168.m_alpha_endpoint_codebook_size =
         math::clamp<int>(*(int *)(*(long *)(in_RDI + 0x2c8) + 0x350),8,0x2000);
    local_168.m_alpha_selector_codebook_size =
         math::clamp<int>(*(int *)(*(long *)(in_RDI + 0x2c8) + 0x354),8,0x2000);
  }
  if ((*(uint *)(*(long *)(in_RDI + 0x2c8) + 0x20) & 0x80000000) != 0) {
    console::debug("Color endpoints: %u",(ulong)local_168.m_color_endpoint_codebook_size);
    console::debug("Color selectors: %u",(ulong)local_168.m_color_selector_codebook_size);
    console::debug("Alpha endpoints: %u",(ulong)local_168.m_alpha_endpoint_codebook_size);
    console::debug("Alpha selectors: %u",(ulong)local_168.m_alpha_selector_codebook_size);
  }
  local_168.m_hierarchical = SUB41((*(uint *)(*(long *)(in_RDI + 0x2c8) + 0x20) & 2) >> 1,0);
  local_168.m_perceptual = (bool)(*(byte *)(*(long *)(in_RDI + 0x2c8) + 0x20) & 1);
  local_168.m_pProgress_func = *(crn_progress_callback_func *)(*(long *)(in_RDI + 0x2c8) + 0x368);
  local_168.m_pProgress_func_data = *(void **)(*(long *)(in_RDI + 0x2c8) + 0x370);
  switch(*(undefined8 *)(*(long *)(in_RDI + 0x2c8) + 0x18)) {
  case 0:
    local_168.m_format = cDXT1;
    *(undefined1 *)(in_RDI + 0x14d0) = 1;
    break;
  case 1:
    *(undefined1 *)(in_RDI + 0x14d1) = 1;
    return false;
  case 2:
    local_168.m_format = cDXT5;
    local_168.m_alpha_component_indices[0] = *(uint *)(*(long *)(in_RDI + 0x2c8) + 0x33c);
    *(undefined1 *)(in_RDI + 0x14d0) = 1;
    *(undefined1 *)(in_RDI + 0x14d1) = 1;
    break;
  case 3:
    local_168.m_format = cDXT5;
    local_168.m_alpha_component_indices[0] = 3;
    *(undefined1 *)(in_RDI + 0x14d0) = 1;
    *(undefined1 *)(in_RDI + 0x14d1) = 1;
    local_168.m_perceptual = false;
    local_168.m_adaptive_tile_color_alpha_weighting_ratio = 1.5;
    break;
  case 4:
  case 5:
  case 6:
    local_168.m_format = cDXT5;
    local_168.m_alpha_component_indices[0] = 3;
    *(undefined1 *)(in_RDI + 0x14d0) = 1;
    *(undefined1 *)(in_RDI + 0x14d1) = 1;
    local_168.m_perceptual = false;
    break;
  case 7:
    local_168.m_format = cDXN_XY;
    local_168.m_alpha_component_indices[0] = 0;
    local_168.m_alpha_component_indices[1] = 1;
    *(undefined1 *)(in_RDI + 0x14d1) = 1;
    *(undefined1 *)(in_RDI + 0x14d2) = 1;
    local_168.m_perceptual = false;
    break;
  case 8:
    local_168.m_format = cDXN_YX;
    local_168.m_alpha_component_indices[0] = 1;
    local_168.m_alpha_component_indices[1] = 0;
    *(undefined1 *)(in_RDI + 0x14d1) = 1;
    *(undefined1 *)(in_RDI + 0x14d2) = 1;
    local_168.m_perceptual = false;
    break;
  case 9:
    local_168.m_format = cDXT5A;
    local_168.m_alpha_component_indices[0] = *(uint *)(*(long *)(in_RDI + 0x2c8) + 0x33c);
    *(undefined1 *)(in_RDI + 0x14d1) = 1;
    local_168.m_perceptual = false;
    break;
  case 10:
    local_168.m_format = cETC1;
    *(undefined1 *)(in_RDI + 0x14d0) = 1;
    break;
  case 0xb:
    local_168.m_format = cETC2;
    *(undefined1 *)(in_RDI + 0x14d0) = 1;
    break;
  case 0xc:
    local_168.m_format = cETC2A;
    local_168.m_alpha_component_indices[0] = *(uint *)(*(long *)(in_RDI + 0x2c8) + 0x33c);
    *(undefined1 *)(in_RDI + 0x14d0) = 1;
    *(undefined1 *)(in_RDI + 0x14d1) = 1;
    break;
  case 0xd:
    local_168.m_format = cETC1S;
    *(undefined1 *)(in_RDI + 0x14d0) = 1;
    break;
  case 0xe:
    local_168.m_format = cETC2AS;
    local_168.m_alpha_component_indices[0] = *(uint *)(*(long *)(in_RDI + 0x2c8) + 0x33c);
    *(undefined1 *)(in_RDI + 0x14d0) = 1;
    *(undefined1 *)(in_RDI + 0x14d1) = 1;
    break;
  default:
    return false;
  }
  local_168.m_debugging = (*(uint *)(*(long *)(in_RDI + 0x2c8) + 0x20) & 0x80000000) != 0;
  local_168.m_pTask_pool = (task_pool *)(in_RDI + 8);
  local_168.m_num_levels = *(uint *)(*(long *)(in_RDI + 0x2c8) + 0x14);
  for (local_18c = 0; local_18c < *(uint *)(*(long *)(in_RDI + 0x2c8) + 0x14);
      local_18c = local_18c + 1) {
    this_01 = (vector<crnlib::crn_comp::level_details> *)(in_RDI + 0x14d8);
    plVar5 = vector<crnlib::crn_comp::level_details>::operator[](this_01,local_18c);
    local_168.m_levels[local_18c].m_first_block = plVar5->first_block;
    plVar5 = vector<crnlib::crn_comp::level_details>::operator[](this_01,local_18c);
    local_168.m_levels[local_18c].m_num_blocks = plVar5->num_blocks;
    plVar5 = vector<crnlib::crn_comp::level_details>::operator[](this_01,local_18c);
    local_168.m_levels[local_18c].m_block_width = plVar5->block_width;
    fVar7 = powf(1.3,(float)local_18c);
    fVar7 = math::minimum<float>(12.0,fVar7);
    local_168.m_levels[local_18c].m_weight = fVar7;
  }
  local_168.m_num_faces = *(uint *)(*(long *)(in_RDI + 0x2c8) + 8);
  local_168.m_num_blocks = *(uint *)(in_RDI + 0x14e8);
  pvVar6 = crnlib_malloc(0x1cb386);
  local_19c = 0;
  for (local_1a0 = 0; local_1a0 < *(uint *)(*(long *)(in_RDI + 0x2c8) + 0x14);
      local_1a0 = local_1a0 + 1) {
    for (local_1a4 = 0; local_1a4 < *(uint *)(*(long *)(in_RDI + 0x2c8) + 8);
        local_1a4 = local_1a4 + 1) {
      this_00 = (image<crnlib::color_quad<unsigned_char,_int>_> *)
                (in_RDI + 0x2d0 + (ulong)local_1a4 * 0x300 + (ulong)local_1a0 * 0x30);
      uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(this_00);
      uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(this_00);
      for (local_1c4 = 0; local_1c4 < (uVar4 + 7 & 0xfffffff8) >> 2; local_1c4 = local_1c4 + 1) {
        for (local_1cc = 0; local_1cc < (uVar3 + 7 & 0xfffffff8) >> 2; local_1cc = local_1cc + 1) {
          local_1d0 = 0;
          for (local_1d8 = 0; local_1d8 < 4; local_1d8 = local_1d8 + 1) {
            uVar2 = math::minimum<unsigned_int>(local_1c4 * 4 + local_1d8,uVar4 - 1);
            for (local_1e0 = 0; local_1e0 < 4; local_1e0 = local_1e0 + 1) {
              x = math::minimum<unsigned_int>(local_1cc * 4 + local_1e0,uVar3 - 1);
              other = image<crnlib::color_quad<unsigned_char,_int>_>::operator()(this_00,x,uVar2);
              color_quad<unsigned_char,_int>::operator=
                        ((color_quad<unsigned_char,_int> *)
                         ((long)pvVar6 + (ulong)local_1d0 * 4 + (ulong)local_19c * 0x40),other);
              local_1d0 = local_1d0 + 1;
            }
          }
          local_19c = local_19c + 1;
        }
      }
    }
  }
  bVar1 = dxt_hc::compress(in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270,
                           in_stack_00000268,in_stack_00000260,in_stack_000002a0,in_stack_000002a8,
                           in_stack_000002b0);
  crnlib_free((void *)0x1cb67b);
  return bVar1;
}

Assistant:

bool crn_comp::quantize_images() {
  dxt_hc::params params;

  params.m_adaptive_tile_alpha_psnr_derating = m_pParams->m_crn_adaptive_tile_alpha_psnr_derating;
  params.m_adaptive_tile_color_psnr_derating = m_pParams->m_crn_adaptive_tile_color_psnr_derating;

  if (m_pParams->m_flags & cCRNCompFlagManualPaletteSizes) {
    params.m_color_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_color_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
    params.m_color_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_color_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
    params.m_alpha_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
    params.m_alpha_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
  } else {
    uint max_codebook_entries = ((m_pParams->m_width + 3) / 4) * ((m_pParams->m_height + 3) / 4);

    max_codebook_entries = math::clamp<uint>(max_codebook_entries, cCRNMinPaletteSize, cCRNMaxPaletteSize);

    float quality = math::clamp<float>((float)m_pParams->m_quality_level / cCRNMaxQualityLevel, 0.0f, 1.0f);
    float color_quality_power_mul = 1.0f;
    float alpha_quality_power_mul = 1.0f;
    if (m_has_etc_color_blocks) {
      color_quality_power_mul = m_has_subblocks ? 1.31f : 0.7f;
      params.m_adaptive_tile_color_psnr_derating = m_has_subblocks ? 5.0f : 2.0f;
    }
    if (m_pParams->m_format == cCRNFmtDXT5_CCxY) {
      color_quality_power_mul = 3.5f;
      alpha_quality_power_mul = .35f;
      params.m_adaptive_tile_color_psnr_derating = 5.0f;
    } else if (m_pParams->m_format == cCRNFmtDXT5) {
      color_quality_power_mul = .75f;
    } else if (m_pParams->m_format == cCRNFmtETC2A) {
      alpha_quality_power_mul = .9f;
    }

    float color_endpoint_quality = powf(quality, 1.8f * color_quality_power_mul);
    float color_selector_quality = powf(quality, 1.65f * color_quality_power_mul);
    params.m_color_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(64, cCRNMinPaletteSize), (float)max_codebook_entries, color_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
    params.m_color_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(96, cCRNMinPaletteSize), (float)max_codebook_entries, color_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);

    float alpha_endpoint_quality = powf(quality, 2.1f * alpha_quality_power_mul);
    float alpha_selector_quality = powf(quality, 1.65f * alpha_quality_power_mul);
    params.m_alpha_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(24, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);    
    params.m_alpha_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(48, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
  }

  if (m_pParams->m_flags & cCRNCompFlagDebugging) {
    console::debug("Color endpoints: %u", params.m_color_endpoint_codebook_size);
    console::debug("Color selectors: %u", params.m_color_selector_codebook_size);
    console::debug("Alpha endpoints: %u", params.m_alpha_endpoint_codebook_size);
    console::debug("Alpha selectors: %u", params.m_alpha_selector_codebook_size);
  }

  params.m_hierarchical = (m_pParams->m_flags & cCRNCompFlagHierarchical) != 0;
  params.m_perceptual = (m_pParams->m_flags & cCRNCompFlagPerceptual) != 0;

  params.m_pProgress_func = m_pParams->m_pProgress_func;
  params.m_pProgress_func_data = m_pParams->m_pProgress_func_data;

  switch (m_pParams->m_format) {
    case cCRNFmtDXT1: {
      params.m_format = cDXT1;
      m_has_comp[cColor] = true;
      break;
    }
    case cCRNFmtDXT3: {
      m_has_comp[cAlpha0] = true;
      return false;
    }
    case cCRNFmtDXT5: {
      params.m_format = cDXT5;
      params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
      m_has_comp[cColor] = true;
      m_has_comp[cAlpha0] = true;
      break;
    }
    case cCRNFmtDXT5_CCxY: {
      params.m_format = cDXT5;
      params.m_alpha_component_indices[0] = 3;
      m_has_comp[cColor] = true;
      m_has_comp[cAlpha0] = true;
      params.m_perceptual = false;

      //params.m_adaptive_tile_color_alpha_weighting_ratio = 1.0f;
      params.m_adaptive_tile_color_alpha_weighting_ratio = 1.5f;
      break;
    }
    case cCRNFmtDXT5_xGBR:
    case cCRNFmtDXT5_AGBR:
    case cCRNFmtDXT5_xGxR: {
      params.m_format = cDXT5;
      params.m_alpha_component_indices[0] = 3;
      m_has_comp[cColor] = true;
      m_has_comp[cAlpha0] = true;
      params.m_perceptual = false;
      break;
    }
    case cCRNFmtDXN_XY: {
      params.m_format = cDXN_XY;
      params.m_alpha_component_indices[0] = 0;
      params.m_alpha_component_indices[1] = 1;
      m_has_comp[cAlpha0] = true;
      m_has_comp[cAlpha1] = true;
      params.m_perceptual = false;
      break;
    }
    case cCRNFmtDXN_YX: {
      params.m_format = cDXN_YX;
      params.m_alpha_component_indices[0] = 1;
      params.m_alpha_component_indices[1] = 0;
      m_has_comp[cAlpha0] = true;
      m_has_comp[cAlpha1] = true;
      params.m_perceptual = false;
      break;
    }
    case cCRNFmtDXT5A: {
      params.m_format = cDXT5A;
      params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
      m_has_comp[cAlpha0] = true;
      params.m_perceptual = false;
      break;
    }
    case cCRNFmtETC1: {
      params.m_format = cETC1;
      m_has_comp[cColor] = true;
      break;
    }
    case cCRNFmtETC2: {
      params.m_format = cETC2;
      m_has_comp[cColor] = true;
      break;
    }
    case cCRNFmtETC2A: {
      params.m_format = cETC2A;
      params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
      m_has_comp[cColor] = true;
      m_has_comp[cAlpha0] = true;
      break;
    }
    case cCRNFmtETC1S: {
      params.m_format = cETC1S;
      m_has_comp[cColor] = true;
      break;
    }
    case cCRNFmtETC2AS: {
      params.m_format = cETC2AS;
      params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
      m_has_comp[cColor] = true;
      m_has_comp[cAlpha0] = true;
      break;
    }
    default: {
      return false;
    }
  }
  params.m_debugging = (m_pParams->m_flags & cCRNCompFlagDebugging) != 0;
  params.m_pTask_pool = &m_task_pool;

  params.m_num_levels = m_pParams->m_levels;
  for (uint i = 0; i < m_pParams->m_levels; i++) {
    params.m_levels[i].m_first_block = m_levels[i].first_block;
    params.m_levels[i].m_num_blocks = m_levels[i].num_blocks;
    params.m_levels[i].m_block_width = m_levels[i].block_width;
    params.m_levels[i].m_weight = math::minimum(12.0f, powf(1.3f, (float)i));
  }
  params.m_num_faces = m_pParams->m_faces;
  params.m_num_blocks = m_total_blocks;
  color_quad_u8 (*blocks)[16] = (color_quad_u8(*)[16])crnlib_malloc(params.m_num_blocks * 16 * sizeof(color_quad_u8));
  for (uint b = 0, level = 0; level < m_pParams->m_levels; level++) {
    for (uint face = 0; face < m_pParams->m_faces; face++) {
      image_u8& image = m_images[face][level];
      uint width = image.get_width();
      uint height = image.get_height();
      uint blockWidth = ((width + 7) & ~7) >> 2;
      uint blockHeight = ((height + 7) & ~7) >> 2;
      for (uint by = 0; by < blockHeight; by++) {
        for (uint y0 = by << 2, bx = 0; bx < blockWidth; bx++, b++) {
          for (uint t = 0, x0 = bx << 2, dy = 0; dy < 4; dy++) {
            for (uint y = math::minimum<uint>(y0 + dy, height - 1), dx = 0; dx < 4; dx++, t++)
              blocks[b][t] = image(math::minimum<uint>(x0 + dx, width - 1), y);
          }
        }
      }
    }
  }
  bool result = m_hvq.compress(blocks, m_endpoint_indices, m_selector_indices, m_color_endpoints, m_alpha_endpoints, m_color_selectors, m_alpha_selectors, params);
  crnlib_free(blocks);

  return result;
}